

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DACSThinker::Tick(DACSThinker *this)

{
  DLevelScript *pDVar1;
  uint uVar2;
  DLevelScript *this_00;
  
  this_00 = this->Scripts;
  while (uVar2 = ACS_StringBuilderStack.Count, this_00 != (DLevelScript *)0x0) {
    pDVar1 = this_00->next;
    DLevelScript::RunScript(this_00);
    this_00 = pDVar1;
  }
  if (ACS_StringBuilderStack.Count != 0) {
    TArray<FString,_FString>::Clear(&ACS_StringBuilderStack);
    I_Error("Error: %d garbage entries on ACS string builder stack.",(ulong)uVar2);
    return;
  }
  return;
}

Assistant:

void DACSThinker::Tick ()
{
	DLevelScript *script = Scripts;

	while (script)
	{
		DLevelScript *next = script->next;
		script->RunScript ();
		script = next;
	}

//	GlobalACSStrings.Clear();

	if (ACS_StringBuilderStack.Size())
	{
		int size = ACS_StringBuilderStack.Size();
		ACS_StringBuilderStack.Clear();
		I_Error("Error: %d garbage entries on ACS string builder stack.", size);
	}
}